

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::BVHNIntersector1<4,_16781328,_false,_embree::sse42::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  char cVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar34;
  float fVar35;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar46;
  float fVar47;
  vfloat4 a0;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar48;
  undefined1 auVar45 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar56;
  float fVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar65;
  float fVar67;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar66;
  float fVar68;
  float fVar69;
  undefined1 auVar64 [16];
  vint4 bi_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 ai;
  undefined1 auVar72 [16];
  float fVar73;
  float fVar75;
  float fVar76;
  vint4 ai_3;
  undefined1 auVar74 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  vint4 ai_1;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar89;
  float fVar90;
  undefined1 auVar88 [16];
  float fVar91;
  float fVar92;
  float fVar94;
  float fVar95;
  undefined1 auVar93 [16];
  float fVar96;
  undefined1 auVar97 [16];
  Precalculations pre;
  NodeRef stack [244];
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8 != 8) && (fVar5 = ray->tfar, 0.0 <= fVar5)) {
    aVar6 = (ray->dir).field_0.field_1;
    fVar84 = aVar6.x;
    fVar85 = aVar6.y;
    fVar86 = aVar6.z;
    auVar25 = dpps((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar41 = rsqrtss(auVar25,auVar25);
    fVar23 = auVar41._0_4_;
    local_818[0] = fVar23 * 1.5 - fVar23 * fVar23 * auVar25._0_4_ * 0.5 * fVar23;
    auVar42._0_4_ = fVar84 * local_818[0];
    auVar42._4_4_ = fVar85 * local_818[0];
    auVar42._8_4_ = fVar86 * local_818[0];
    auVar42._12_4_ = aVar6.field_3.w * local_818[0];
    uVar18 = CONCAT44(auVar42._4_4_,auVar42._4_4_);
    auVar26._0_8_ = uVar18 ^ 0x8000000080000000;
    auVar26._8_4_ = -auVar42._12_4_;
    auVar26._12_4_ = -auVar42._12_4_;
    auVar53._0_12_ = ZEXT812(0);
    auVar53._12_4_ = 0;
    auVar26 = blendps(auVar26,auVar53,0xe);
    auVar25._4_4_ = auVar26._0_4_;
    auVar25._0_4_ = auVar42._8_4_;
    auVar25._8_4_ = auVar26._4_4_;
    auVar25._12_4_ = 0;
    auVar41._4_4_ = auVar26._0_4_;
    auVar41._0_4_ = auVar42._8_4_;
    auVar41._8_4_ = auVar26._4_4_;
    auVar41._12_4_ = 0;
    auVar74 = dpps(auVar41 << 0x20,auVar25 << 0x20,0x7f);
    uVar18 = CONCAT44(auVar42._12_4_,auVar42._8_4_);
    auVar61._0_8_ = uVar18 ^ 0x8000000080000000;
    auVar61._8_4_ = -auVar42._8_4_;
    auVar61._12_4_ = -auVar42._12_4_;
    auVar26 = insertps(auVar61,auVar42,0x2a);
    auVar41 = dpps(auVar26,auVar26,0x7f);
    iVar22 = -(uint)(auVar41._0_4_ < auVar74._0_4_);
    auVar74._4_4_ = iVar22;
    auVar74._0_4_ = iVar22;
    auVar74._8_4_ = iVar22;
    auVar74._12_4_ = iVar22;
    auVar25 = blendvps(auVar26,auVar25 << 0x20,auVar74);
    auVar41 = dpps(auVar25,auVar25,0x7f);
    auVar26 = rsqrtss(auVar41,auVar41);
    fVar23 = auVar26._0_4_;
    fVar23 = fVar23 * 1.5 - fVar23 * fVar23 * auVar41._0_4_ * 0.5 * fVar23;
    fVar24 = fVar23 * auVar25._0_4_;
    fVar34 = fVar23 * auVar25._4_4_;
    fVar35 = fVar23 * auVar25._8_4_;
    fVar23 = fVar23 * auVar25._12_4_;
    fVar59 = fVar34 * auVar42._0_4_ - auVar42._4_4_ * fVar24;
    fVar65 = fVar35 * auVar42._4_4_ - auVar42._8_4_ * fVar34;
    fVar67 = fVar24 * auVar42._8_4_ - auVar42._0_4_ * fVar35;
    auVar62._12_4_ = fVar23 * auVar42._12_4_ - auVar42._12_4_ * fVar23;
    auVar62._0_8_ = CONCAT44(fVar67,fVar65);
    auVar62._8_4_ = fVar59;
    auVar70._8_4_ = fVar59;
    auVar70._0_8_ = auVar62._0_8_;
    auVar70._12_4_ = auVar62._12_4_;
    auVar25 = dpps(auVar70,auVar62,0x7f);
    auVar41 = rsqrtss(auVar25,auVar25);
    fVar23 = auVar41._0_4_;
    fVar23 = fVar23 * 1.5 - fVar23 * fVar23 * auVar25._0_4_ * 0.5 * fVar23;
    local_7e8._4_4_ = fVar23 * fVar59;
    local_7e8._0_4_ = fVar35;
    local_7e8._8_4_ = auVar42._8_4_ * local_818[0];
    local_7e8._12_4_ = 0;
    local_808._4_4_ = fVar23 * fVar65;
    local_808._0_4_ = fVar24;
    local_808._8_4_ = auVar42._0_4_ * local_818[0];
    local_808._12_4_ = 0;
    local_7f8._4_4_ = fVar23 * fVar67;
    local_7f8._0_4_ = fVar34;
    local_7f8._8_4_ = auVar42._4_4_ * local_818[0];
    local_7f8._12_4_ = 0;
    puVar19 = local_7d0;
    fVar24 = (ray->org).field_0.m128[0];
    fVar34 = (ray->org).field_0.m128[1];
    fVar35 = (ray->org).field_0.m128[2];
    fVar59 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar23 = 0.0;
    if (0.0 <= fVar59) {
      fVar23 = fVar59;
    }
    auVar27._4_4_ = -(uint)(ABS(fVar85) < DAT_01f4bd50._4_4_);
    auVar27._0_4_ = -(uint)(ABS(fVar84) < (float)DAT_01f4bd50);
    auVar27._8_4_ = -(uint)(ABS(fVar86) < DAT_01f4bd50._8_4_);
    auVar27._12_4_ = -(uint)(ABS(aVar6.field_3.w) < DAT_01f4bd50._12_4_);
    auVar41 = blendvps((undefined1  [16])aVar6,_DAT_01f4bd50,auVar27);
    auVar25 = rcpps(auVar27,auVar41);
    fVar59 = auVar25._0_4_;
    fVar65 = auVar25._4_4_;
    fVar67 = auVar25._8_4_;
    fVar59 = (1.0 - auVar41._0_4_ * fVar59) * fVar59 + fVar59;
    fVar65 = (1.0 - auVar41._4_4_ * fVar65) * fVar65 + fVar65;
    fVar67 = (1.0 - auVar41._8_4_ * fVar67) * fVar67 + fVar67;
    uVar21 = (ulong)(fVar59 < 0.0) * 0x10;
    uVar18 = (ulong)(fVar65 < 0.0) << 4 | 0x20;
    uVar20 = (ulong)(fVar67 < 0.0) << 4 | 0x40;
    auVar72._4_4_ = fVar23;
    auVar72._0_4_ = fVar23;
    auVar72._8_4_ = fVar23;
    auVar72._12_4_ = fVar23;
LAB_0067bf4c:
    if (puVar19 != &local_7d8) {
      uVar15 = puVar19[-1];
      puVar19 = puVar19 + -1;
      do {
        fVar23 = (ray->dir).field_0.m128[3];
        fVar82 = 1.0 - fVar23;
        fVar83 = fVar82 * 0.0;
        do {
          if ((uVar15 & 8) != 0) {
            cVar13 = (**(code **)((long)This->leafIntersector +
                                 (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 8))
                               (local_818,ray,context);
            if (cVar13 != '\0') {
              ray->tfar = -INFINITY;
              return;
            }
            goto LAB_0067bf4c;
          }
          uVar16 = (uint)uVar15 & 7;
          uVar14 = uVar15 & 0xfffffffffffffff0;
          if (uVar16 == 3) {
            auVar88._0_4_ =
                 fVar84 * *(float *)(uVar14 + 0x20) +
                 fVar85 * *(float *)(uVar14 + 0x50) + fVar86 * *(float *)(uVar14 + 0x80);
            auVar88._4_4_ =
                 fVar84 * *(float *)(uVar14 + 0x24) +
                 fVar85 * *(float *)(uVar14 + 0x54) + fVar86 * *(float *)(uVar14 + 0x84);
            auVar88._8_4_ =
                 fVar84 * *(float *)(uVar14 + 0x28) +
                 fVar85 * *(float *)(uVar14 + 0x58) + fVar86 * *(float *)(uVar14 + 0x88);
            auVar88._12_4_ =
                 fVar84 * *(float *)(uVar14 + 0x2c) +
                 fVar85 * *(float *)(uVar14 + 0x5c) + fVar86 * *(float *)(uVar14 + 0x8c);
            auVar93._0_4_ =
                 fVar84 * *(float *)(uVar14 + 0x30) +
                 fVar85 * *(float *)(uVar14 + 0x60) + fVar86 * *(float *)(uVar14 + 0x90);
            auVar93._4_4_ =
                 fVar84 * *(float *)(uVar14 + 0x34) +
                 fVar85 * *(float *)(uVar14 + 100) + fVar86 * *(float *)(uVar14 + 0x94);
            auVar93._8_4_ =
                 fVar84 * *(float *)(uVar14 + 0x38) +
                 fVar85 * *(float *)(uVar14 + 0x68) + fVar86 * *(float *)(uVar14 + 0x98);
            auVar93._12_4_ =
                 fVar84 * *(float *)(uVar14 + 0x3c) +
                 fVar85 * *(float *)(uVar14 + 0x6c) + fVar86 * *(float *)(uVar14 + 0x9c);
            local_878 = (float)*(undefined8 *)(uVar14 + 0x40);
            fStack_874 = (float)((ulong)*(undefined8 *)(uVar14 + 0x40) >> 0x20);
            fStack_870 = (float)*(undefined8 *)(uVar14 + 0x48);
            fStack_86c = (float)((ulong)*(undefined8 *)(uVar14 + 0x48) >> 0x20);
            auVar97._0_4_ =
                 fVar84 * local_878 +
                 fVar85 * *(float *)(uVar14 + 0x70) + fVar86 * *(float *)(uVar14 + 0xa0);
            auVar97._4_4_ =
                 fVar84 * fStack_874 +
                 fVar85 * *(float *)(uVar14 + 0x74) + fVar86 * *(float *)(uVar14 + 0xa4);
            auVar97._8_4_ =
                 fVar84 * fStack_870 +
                 fVar85 * *(float *)(uVar14 + 0x78) + fVar86 * *(float *)(uVar14 + 0xa8);
            auVar97._12_4_ =
                 fVar84 * fStack_86c +
                 fVar85 * *(float *)(uVar14 + 0x7c) + fVar86 * *(float *)(uVar14 + 0xac);
            fVar40 = (float)DAT_01f4bd50;
            fVar46 = DAT_01f4bd50._4_4_;
            fVar47 = DAT_01f4bd50._8_4_;
            fVar48 = DAT_01f4bd50._12_4_;
            auVar30._4_4_ = -(uint)(ABS(auVar88._4_4_) < fVar46);
            auVar30._0_4_ = -(uint)(ABS(auVar88._0_4_) < fVar40);
            auVar30._8_4_ = -(uint)(ABS(auVar88._8_4_) < fVar47);
            auVar30._12_4_ = -(uint)(ABS(auVar88._12_4_) < fVar48);
            auVar41 = blendvps(auVar88,_DAT_01f4bd50,auVar30);
            auVar31._4_4_ = -(uint)(ABS(auVar93._4_4_) < fVar46);
            auVar31._0_4_ = -(uint)(ABS(auVar93._0_4_) < fVar40);
            auVar31._8_4_ = -(uint)(ABS(auVar93._8_4_) < fVar47);
            auVar31._12_4_ = -(uint)(ABS(auVar93._12_4_) < fVar48);
            auVar26 = blendvps(auVar93,_DAT_01f4bd50,auVar31);
            auVar32._4_4_ = -(uint)(ABS(auVar97._4_4_) < fVar46);
            auVar32._0_4_ = -(uint)(ABS(auVar97._0_4_) < fVar40);
            auVar32._8_4_ = -(uint)(ABS(auVar97._8_4_) < fVar47);
            auVar32._12_4_ = -(uint)(ABS(auVar97._12_4_) < fVar48);
            auVar74 = blendvps(auVar97,_DAT_01f4bd50,auVar32);
            auVar25 = rcpps(_DAT_01f4bd50,auVar41);
            fVar40 = auVar25._0_4_;
            fVar46 = auVar25._4_4_;
            fVar47 = auVar25._8_4_;
            fVar48 = auVar25._12_4_;
            fVar40 = (1.0 - auVar41._0_4_ * fVar40) * fVar40 + fVar40;
            fVar46 = (1.0 - auVar41._4_4_ * fVar46) * fVar46 + fVar46;
            fVar47 = (1.0 - auVar41._8_4_ * fVar47) * fVar47 + fVar47;
            fVar48 = (1.0 - auVar41._12_4_ * fVar48) * fVar48 + fVar48;
            auVar25 = rcpps(auVar25,auVar26);
            fVar87 = auVar25._0_4_;
            fVar89 = auVar25._4_4_;
            fVar90 = auVar25._8_4_;
            fVar91 = auVar25._12_4_;
            fVar87 = (1.0 - auVar26._0_4_ * fVar87) * fVar87 + fVar87;
            fVar89 = (1.0 - auVar26._4_4_ * fVar89) * fVar89 + fVar89;
            fVar90 = (1.0 - auVar26._8_4_ * fVar90) * fVar90 + fVar90;
            fVar91 = (1.0 - auVar26._12_4_ * fVar91) * fVar91 + fVar91;
            auVar25 = rcpps(auVar25,auVar74);
            fVar92 = auVar25._0_4_;
            fVar94 = auVar25._4_4_;
            fVar95 = auVar25._8_4_;
            fVar96 = auVar25._12_4_;
            fVar92 = (1.0 - auVar74._0_4_ * fVar92) * fVar92 + fVar92;
            fVar94 = (1.0 - auVar74._4_4_ * fVar94) * fVar94 + fVar94;
            fVar95 = (1.0 - auVar74._8_4_ * fVar95) * fVar95 + fVar95;
            fVar96 = (1.0 - auVar74._12_4_ * fVar96) * fVar96 + fVar96;
            fVar60 = *(float *)(uVar14 + 0x20) * fVar24 +
                     *(float *)(uVar14 + 0x50) * fVar34 +
                     *(float *)(uVar14 + 0x80) * fVar35 + *(float *)(uVar14 + 0xb0);
            fVar66 = *(float *)(uVar14 + 0x24) * fVar24 +
                     *(float *)(uVar14 + 0x54) * fVar34 +
                     *(float *)(uVar14 + 0x84) * fVar35 + *(float *)(uVar14 + 0xb4);
            fVar68 = *(float *)(uVar14 + 0x28) * fVar24 +
                     *(float *)(uVar14 + 0x58) * fVar34 +
                     *(float *)(uVar14 + 0x88) * fVar35 + *(float *)(uVar14 + 0xb8);
            fVar69 = *(float *)(uVar14 + 0x2c) * fVar24 +
                     *(float *)(uVar14 + 0x5c) * fVar34 +
                     *(float *)(uVar14 + 0x8c) * fVar35 + *(float *)(uVar14 + 0xbc);
            fVar52 = *(float *)(uVar14 + 0x30) * fVar24 +
                     *(float *)(uVar14 + 0x60) * fVar34 +
                     *(float *)(uVar14 + 0x90) * fVar35 + *(float *)(uVar14 + 0xc0);
            fVar56 = *(float *)(uVar14 + 0x34) * fVar24 +
                     *(float *)(uVar14 + 100) * fVar34 +
                     *(float *)(uVar14 + 0x94) * fVar35 + *(float *)(uVar14 + 0xc4);
            fVar57 = *(float *)(uVar14 + 0x38) * fVar24 +
                     *(float *)(uVar14 + 0x68) * fVar34 +
                     *(float *)(uVar14 + 0x98) * fVar35 + *(float *)(uVar14 + 200);
            fVar58 = *(float *)(uVar14 + 0x3c) * fVar24 +
                     *(float *)(uVar14 + 0x6c) * fVar34 +
                     *(float *)(uVar14 + 0x9c) * fVar35 + *(float *)(uVar14 + 0xcc);
            fVar36 = local_878 * fVar24 +
                     *(float *)(uVar14 + 0x70) * fVar34 +
                     *(float *)(uVar14 + 0xa0) * fVar35 + *(float *)(uVar14 + 0xd0);
            fVar37 = fStack_874 * fVar24 +
                     *(float *)(uVar14 + 0x74) * fVar34 +
                     *(float *)(uVar14 + 0xa4) * fVar35 + *(float *)(uVar14 + 0xd4);
            fVar38 = fStack_870 * fVar24 +
                     *(float *)(uVar14 + 0x78) * fVar34 +
                     *(float *)(uVar14 + 0xa8) * fVar35 + *(float *)(uVar14 + 0xd8);
            fVar39 = fStack_86c * fVar24 +
                     *(float *)(uVar14 + 0x7c) * fVar34 +
                     *(float *)(uVar14 + 0xac) * fVar35 + *(float *)(uVar14 + 0xdc);
            fVar78 = ((*(float *)(uVar14 + 0xe0) * fVar23 + fVar83) - fVar60) * fVar40;
            fVar79 = ((*(float *)(uVar14 + 0xe4) * fVar23 + fVar83) - fVar66) * fVar46;
            fVar80 = ((*(float *)(uVar14 + 0xe8) * fVar23 + fVar83) - fVar68) * fVar47;
            fVar81 = ((*(float *)(uVar14 + 0xec) * fVar23 + fVar83) - fVar69) * fVar48;
            fVar40 = ((*(float *)(uVar14 + 0x110) * fVar23 + fVar82) - fVar60) * fVar40;
            fVar46 = ((*(float *)(uVar14 + 0x114) * fVar23 + fVar82) - fVar66) * fVar46;
            fVar47 = ((*(float *)(uVar14 + 0x118) * fVar23 + fVar82) - fVar68) * fVar47;
            fVar48 = ((*(float *)(uVar14 + 0x11c) * fVar23 + fVar82) - fVar69) * fVar48;
            fVar73 = ((*(float *)(uVar14 + 0xf0) * fVar23 + fVar83) - fVar52) * fVar87;
            fVar75 = ((*(float *)(uVar14 + 0xf4) * fVar23 + fVar83) - fVar56) * fVar89;
            fVar76 = ((*(float *)(uVar14 + 0xf8) * fVar23 + fVar83) - fVar57) * fVar90;
            fVar77 = ((*(float *)(uVar14 + 0xfc) * fVar23 + fVar83) - fVar58) * fVar91;
            fVar60 = ((*(float *)(uVar14 + 0x100) * fVar23 + fVar83) - fVar36) * fVar92;
            fVar66 = ((*(float *)(uVar14 + 0x104) * fVar23 + fVar83) - fVar37) * fVar94;
            fVar68 = ((*(float *)(uVar14 + 0x108) * fVar23 + fVar83) - fVar38) * fVar95;
            fVar69 = ((*(float *)(uVar14 + 0x10c) * fVar23 + fVar83) - fVar39) * fVar96;
            fVar87 = ((*(float *)(uVar14 + 0x120) * fVar23 + fVar82) - fVar52) * fVar87;
            fVar89 = ((*(float *)(uVar14 + 0x124) * fVar23 + fVar82) - fVar56) * fVar89;
            fVar90 = ((*(float *)(uVar14 + 0x128) * fVar23 + fVar82) - fVar57) * fVar90;
            fVar91 = ((*(float *)(uVar14 + 300) * fVar23 + fVar82) - fVar58) * fVar91;
            fVar92 = ((*(float *)(uVar14 + 0x130) * fVar23 + fVar82) - fVar36) * fVar92;
            fVar94 = ((*(float *)(uVar14 + 0x134) * fVar23 + fVar82) - fVar37) * fVar94;
            fVar95 = ((*(float *)(uVar14 + 0x138) * fVar23 + fVar82) - fVar38) * fVar95;
            fVar96 = ((*(float *)(uVar14 + 0x13c) * fVar23 + fVar82) - fVar39) * fVar96;
            auVar33._0_4_ =
                 (uint)((int)fVar87 < (int)fVar73) * (int)fVar87 |
                 (uint)((int)fVar87 >= (int)fVar73) * (int)fVar73;
            auVar33._4_4_ =
                 (uint)((int)fVar89 < (int)fVar75) * (int)fVar89 |
                 (uint)((int)fVar89 >= (int)fVar75) * (int)fVar75;
            auVar33._8_4_ =
                 (uint)((int)fVar90 < (int)fVar76) * (int)fVar90 |
                 (uint)((int)fVar90 >= (int)fVar76) * (int)fVar76;
            auVar33._12_4_ =
                 (uint)((int)fVar91 < (int)fVar77) * (int)fVar91 |
                 (uint)((int)fVar91 >= (int)fVar77) * (int)fVar77;
            auVar50._0_4_ =
                 (uint)((int)fVar92 < (int)fVar60) * (int)fVar92 |
                 (uint)((int)fVar92 >= (int)fVar60) * (int)fVar60;
            auVar50._4_4_ =
                 (uint)((int)fVar94 < (int)fVar66) * (int)fVar94 |
                 (uint)((int)fVar94 >= (int)fVar66) * (int)fVar66;
            auVar50._8_4_ =
                 (uint)((int)fVar95 < (int)fVar68) * (int)fVar95 |
                 (uint)((int)fVar95 >= (int)fVar68) * (int)fVar68;
            auVar50._12_4_ =
                 (uint)((int)fVar96 < (int)fVar69) * (int)fVar96 |
                 (uint)((int)fVar96 >= (int)fVar69) * (int)fVar69;
            auVar25 = maxps(auVar33,auVar50);
            auVar51._0_4_ =
                 (uint)((int)fVar40 < (int)fVar78) * (int)fVar40 |
                 (uint)((int)fVar40 >= (int)fVar78) * (int)fVar78;
            auVar51._4_4_ =
                 (uint)((int)fVar46 < (int)fVar79) * (int)fVar46 |
                 (uint)((int)fVar46 >= (int)fVar79) * (int)fVar79;
            auVar51._8_4_ =
                 (uint)((int)fVar47 < (int)fVar80) * (int)fVar47 |
                 (uint)((int)fVar47 >= (int)fVar80) * (int)fVar80;
            auVar51._12_4_ =
                 (uint)((int)fVar48 < (int)fVar81) * (int)fVar48 |
                 (uint)((int)fVar48 >= (int)fVar81) * (int)fVar81;
            auVar71._0_4_ =
                 (uint)((int)fVar40 < (int)fVar78) * (int)fVar78 |
                 (uint)((int)fVar40 >= (int)fVar78) * (int)fVar40;
            auVar71._4_4_ =
                 (uint)((int)fVar46 < (int)fVar79) * (int)fVar79 |
                 (uint)((int)fVar46 >= (int)fVar79) * (int)fVar46;
            auVar71._8_4_ =
                 (uint)((int)fVar47 < (int)fVar80) * (int)fVar80 |
                 (uint)((int)fVar47 >= (int)fVar80) * (int)fVar47;
            auVar71._12_4_ =
                 (uint)((int)fVar48 < (int)fVar81) * (int)fVar81 |
                 (uint)((int)fVar48 >= (int)fVar81) * (int)fVar48;
            auVar12._4_4_ = fVar5;
            auVar12._0_4_ = fVar5;
            auVar12._8_4_ = fVar5;
            auVar12._12_4_ = fVar5;
            auVar64._0_4_ =
                 (uint)((int)fVar87 < (int)fVar73) * (int)fVar73 |
                 (uint)((int)fVar87 >= (int)fVar73) * (int)fVar87;
            auVar64._4_4_ =
                 (uint)((int)fVar89 < (int)fVar75) * (int)fVar75 |
                 (uint)((int)fVar89 >= (int)fVar75) * (int)fVar89;
            auVar64._8_4_ =
                 (uint)((int)fVar90 < (int)fVar76) * (int)fVar76 |
                 (uint)((int)fVar90 >= (int)fVar76) * (int)fVar90;
            auVar64._12_4_ =
                 (uint)((int)fVar91 < (int)fVar77) * (int)fVar77 |
                 (uint)((int)fVar91 >= (int)fVar77) * (int)fVar91;
            auVar45._0_4_ =
                 (uint)((int)fVar92 < (int)fVar60) * (int)fVar60 |
                 (uint)((int)fVar92 >= (int)fVar60) * (int)fVar92;
            auVar45._4_4_ =
                 (uint)((int)fVar94 < (int)fVar66) * (int)fVar66 |
                 (uint)((int)fVar94 >= (int)fVar66) * (int)fVar94;
            auVar45._8_4_ =
                 (uint)((int)fVar95 < (int)fVar68) * (int)fVar68 |
                 (uint)((int)fVar95 >= (int)fVar68) * (int)fVar95;
            auVar45._12_4_ =
                 (uint)((int)fVar96 < (int)fVar69) * (int)fVar69 |
                 (uint)((int)fVar96 >= (int)fVar69) * (int)fVar96;
            auVar26 = minps(auVar64,auVar45);
            auVar41 = maxps(auVar72,auVar51);
            auVar41 = maxps(auVar41,auVar25);
            auVar25 = minps(auVar12,auVar71);
            auVar25 = minps(auVar25,auVar26);
LAB_0067c07c:
            bVar8 = auVar41._0_4_ <= auVar25._0_4_;
            bVar9 = auVar41._4_4_ <= auVar25._4_4_;
            bVar10 = auVar41._8_4_ <= auVar25._8_4_;
            bVar11 = auVar41._12_4_ <= auVar25._12_4_;
          }
          else {
            pfVar3 = (float *)(uVar14 + 0x80 + uVar21);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar21);
            pfVar4 = (float *)(uVar14 + 0x80 + uVar18);
            pfVar2 = (float *)(uVar14 + 0x20 + uVar18);
            auVar28._0_4_ = ((*pfVar3 * fVar23 + *pfVar1) - fVar24) * fVar59;
            auVar28._4_4_ = ((pfVar3[1] * fVar23 + pfVar1[1]) - fVar24) * fVar59;
            auVar28._8_4_ = ((pfVar3[2] * fVar23 + pfVar1[2]) - fVar24) * fVar59;
            auVar28._12_4_ = ((pfVar3[3] * fVar23 + pfVar1[3]) - fVar24) * fVar59;
            auVar49._0_4_ = ((*pfVar4 * fVar23 + *pfVar2) - fVar34) * fVar65;
            auVar49._4_4_ = ((pfVar4[1] * fVar23 + pfVar2[1]) - fVar34) * fVar65;
            auVar49._8_4_ = ((pfVar4[2] * fVar23 + pfVar2[2]) - fVar34) * fVar65;
            auVar49._12_4_ = ((pfVar4[3] * fVar23 + pfVar2[3]) - fVar34) * fVar65;
            pfVar2 = (float *)(uVar14 + 0x80 + uVar20);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar20);
            auVar43._0_4_ = ((*pfVar2 * fVar23 + *pfVar1) - fVar35) * fVar67;
            auVar43._4_4_ = ((pfVar2[1] * fVar23 + pfVar1[1]) - fVar35) * fVar67;
            auVar43._8_4_ = ((pfVar2[2] * fVar23 + pfVar1[2]) - fVar35) * fVar67;
            auVar43._12_4_ = ((pfVar2[3] * fVar23 + pfVar1[3]) - fVar35) * fVar67;
            auVar25 = maxps(auVar49,auVar43);
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar21 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar21 ^ 0x10));
            auVar63._0_4_ = ((*pfVar2 * fVar23 + *pfVar1) - fVar24) * fVar59;
            auVar63._4_4_ = ((pfVar2[1] * fVar23 + pfVar1[1]) - fVar24) * fVar59;
            auVar63._8_4_ = ((pfVar2[2] * fVar23 + pfVar1[2]) - fVar24) * fVar59;
            auVar63._12_4_ = ((pfVar2[3] * fVar23 + pfVar1[3]) - fVar24) * fVar59;
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar18 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar18 ^ 0x10));
            auVar44._0_4_ = ((*pfVar2 * fVar23 + *pfVar1) - fVar34) * fVar65;
            auVar44._4_4_ = ((pfVar2[1] * fVar23 + pfVar1[1]) - fVar34) * fVar65;
            auVar44._8_4_ = ((pfVar2[2] * fVar23 + pfVar1[2]) - fVar34) * fVar65;
            auVar44._12_4_ = ((pfVar2[3] * fVar23 + pfVar1[3]) - fVar34) * fVar65;
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar20 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar20 ^ 0x10));
            auVar54._0_4_ = ((*pfVar2 * fVar23 + *pfVar1) - fVar35) * fVar67;
            auVar54._4_4_ = ((pfVar2[1] * fVar23 + pfVar1[1]) - fVar35) * fVar67;
            auVar54._8_4_ = ((pfVar2[2] * fVar23 + pfVar1[2]) - fVar35) * fVar67;
            auVar54._12_4_ = ((pfVar2[3] * fVar23 + pfVar1[3]) - fVar35) * fVar67;
            auVar26 = minps(auVar44,auVar54);
            auVar41 = maxps(auVar72,auVar28);
            auVar41 = maxps(auVar41,auVar25);
            auVar29._4_4_ = fVar5;
            auVar29._0_4_ = fVar5;
            auVar29._8_4_ = fVar5;
            auVar29._12_4_ = fVar5;
            auVar25 = minps(auVar29,auVar63);
            auVar25 = minps(auVar25,auVar26);
            if (uVar16 != 6) goto LAB_0067c07c;
            bVar8 = auVar41._0_4_ <= auVar25._0_4_ &&
                    (fVar23 < *(float *)(uVar14 + 0xf0) && *(float *)(uVar14 + 0xe0) <= fVar23);
            bVar9 = auVar41._4_4_ <= auVar25._4_4_ &&
                    (fVar23 < *(float *)(uVar14 + 0xf4) && *(float *)(uVar14 + 0xe4) <= fVar23);
            bVar10 = auVar41._8_4_ <= auVar25._8_4_ &&
                     (fVar23 < *(float *)(uVar14 + 0xf8) && *(float *)(uVar14 + 0xe8) <= fVar23);
            bVar11 = auVar41._12_4_ <= auVar25._12_4_ &&
                     (fVar23 < *(float *)(uVar14 + 0xfc) && *(float *)(uVar14 + 0xec) <= fVar23);
          }
          auVar55._0_4_ = (uint)bVar8 * -0x80000000;
          auVar55._4_4_ = (uint)bVar9 * -0x80000000;
          auVar55._8_4_ = (uint)bVar10 * -0x80000000;
          auVar55._12_4_ = (uint)bVar11 * -0x80000000;
          uVar16 = movmskps((uint)uVar15,auVar55);
          if (uVar16 == 0) goto LAB_0067bf4c;
          uVar16 = uVar16 & 0xff;
          lVar7 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar15 = *(ulong *)(uVar14 + lVar7 * 8);
          uVar16 = uVar16 - 1 & uVar16;
          uVar17 = (ulong)uVar16;
        } while (uVar16 == 0);
        do {
          *puVar19 = uVar15;
          puVar19 = puVar19 + 1;
          lVar7 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar15 = *(ulong *)(uVar14 + lVar7 * 8);
          uVar17 = uVar17 - 1 & uVar17;
        } while (uVar17 != 0);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }